

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbg.c
# Opt level: O1

void dbgpval(dbgcxdef *ctx,runsdef *val,_func_void_void_ptr_char_ptr_int *dispfn,void *dispctx,
            int showtype)

{
  bool bVar1;
  byte bVar2;
  size_t sVar3;
  int iVar4;
  char *pcVar5;
  uint len;
  uchar *p;
  uchar buf [40];
  uint local_6c;
  ushort *local_68;
  int local_5c;
  ushort local_58 [20];
  
  local_68 = local_58;
  switch(val->runstyp) {
  case '\x01':
    sprintf((char *)local_58,"%ld",(val->runsv).runsvnum);
    sVar3 = strlen((char *)local_58);
    local_6c = (uint)sVar3;
    pcVar5 = "number";
    break;
  case '\x02':
    local_6c = dbgnam(ctx,(char *)local_58,2,(uint)(val->runsv).runsvobj);
    pcVar5 = "object";
    break;
  case '\x03':
    local_6c = *(ushort *)(val->runsv).runsvstr - 2;
    local_68 = (ushort *)((long)(val->runsv).runsvstr + 2);
    pcVar5 = "string";
    break;
  default:
    local_68 = (ushort *)0x13a58f;
    local_6c = 0xe;
    goto LAB_001218c7;
  case '\x05':
    local_68 = (ushort *)0x139d5d;
    local_6c = 3;
    goto LAB_001218c7;
  case '\a':
    local_5c = showtype;
    if (showtype != 0) {
      (*dispfn)(dispctx,"list: ",6);
    }
    (*dispfn)(dispctx,"[",1);
    local_68 = (ushort *)((long)(val->runsv).runsvstr + 2);
    local_6c = *(ushort *)(val->runsv).runsvstr - 2;
    if (local_6c != 0) {
      do {
        dbgpbval(ctx,(uint)(byte)*local_68,(byte *)((long)local_68 + 1),dispfn,dispctx);
        lstadv((uchar **)&local_68,&local_6c);
        if (local_6c != 0) {
          (*dispfn)(dispctx," ",1);
        }
      } while (local_6c != 0);
    }
    (*dispfn)(dispctx,"]",1);
    local_6c = 0;
    bVar2 = 0;
    pcVar5 = (char *)0x0;
    showtype = local_5c;
    goto LAB_00121983;
  case '\b':
    local_68 = (ushort *)0x139d61;
    local_6c = 4;
LAB_001218c7:
    bVar2 = 0;
    pcVar5 = (char *)0x0;
    goto LAB_00121983;
  case '\n':
    local_6c = dbgnam(ctx,(char *)local_58,1,(uint)(val->runsv).runsvobj);
    pcVar5 = "function pointer";
    break;
  case '\r':
    local_6c = dbgnam(ctx,(char *)local_58,3,(uint)(val->runsv).runsvobj);
    pcVar5 = "property pointer";
  }
  bVar2 = 1;
LAB_00121983:
  bVar1 = (bool)(showtype != 0 & bVar2);
  if (bVar1) {
    sVar3 = strlen(pcVar5);
    (*dispfn)(dispctx,pcVar5,(int)sVar3);
    pcVar5 = ": ";
    iVar4 = 2;
  }
  else {
    if (val->runstyp != '\x03') goto LAB_001219cc;
    pcVar5 = "\'";
    iVar4 = 1;
  }
  (*dispfn)(dispctx,pcVar5,iVar4);
LAB_001219cc:
  if ((ulong)local_6c < 0x28) {
    *(undefined1 *)((long)local_58 + (ulong)local_6c) = 0;
  }
  if ((val->runstyp == '\r') || (val->runstyp == '\n')) {
    (*dispfn)(dispctx,"&",1);
  }
  if (local_6c != 0) {
    (*dispfn)(dispctx,(char *)local_68,local_6c);
  }
  if (!(bool)(bVar1 | val->runstyp != '\x03')) {
    (*dispfn)(dispctx,"\'",1);
  }
  return;
}

Assistant:

void dbgpval(dbgcxdef *ctx, runsdef *val,
             void (*dispfn)(void *ctx, const char *str, int strl),
             void *dispctx,
             int showtype)
{
    uchar   buf[TOKNAMMAX + 1];
    uint    len;
    uchar  *p = buf;
    char   *typ = 0;
    
    switch(val->runstyp)
    {
    case DAT_NUMBER:
        sprintf((char *)buf, "%ld", val->runsv.runsvnum);
        len = strlen((char *)buf);
        typ = "number";
        break;
        
    case DAT_OBJECT:
        len = dbgnam(ctx, (char *)buf, TOKSTOBJ, val->runsv.runsvobj);
        typ = "object";
        break;
        
    case DAT_SSTRING:
        len = osrp2(val->runsv.runsvstr) - 2;
        p = val->runsv.runsvstr + 2;
        typ = "string";
        break;
        
    case DAT_NIL:
        p = (uchar *)"nil";
        len = 3;
        break;

    case DAT_LIST:
        if (showtype) (*dispfn)(dispctx, "list: ", 6);
        (*dispfn)(dispctx, "[", 1);
        len = osrp2(val->runsv.runsvstr) - 2;
        p = val->runsv.runsvstr + 2;
        while (len)
        {
            dbgpbval(ctx, (dattyp)*p, (uchar *)(p + 1), dispfn, dispctx);
            lstadv(&p, &len);
            if (len) (*dispfn)(dispctx, " ", 1);
        }
        (*dispfn)(dispctx, "]", 1);
        len = 0;
        break;
        
    case DAT_TRUE:
        p = (uchar *)"true";
        len = 4;
        break;
        
    case DAT_FNADDR:
        len = dbgnam(ctx, (char *)buf, TOKSTFUNC, val->runsv.runsvobj);
        typ = "function pointer";
        break;
        
    case DAT_PROPNUM:
        len = dbgnam(ctx, (char *)buf, TOKSTPROP, val->runsv.runsvprp);
        typ = "property pointer";
        break;
        
    default:
        p = (uchar *)"[unknown type]";
        len = 14;
        break;
    }

    /* show the type prefix if desired, or add a quote if it's a string */
    if (typ && showtype)
    {
        /* show the type prefix */
        (*dispfn)(dispctx, typ, (int)strlen(typ));
        (*dispfn)(dispctx, ": ", 2);
    }
    else if (val->runstyp == DAT_SSTRING)
    {
        /* it's a string, and we're not showing a type - add a quote */
        (*dispfn)(dispctx, "'", 1);
    }

    /* 
     *   if possible, null-terminate the buffer - do this only if the
     *   length is actually within the buffer, which won't be the case if
     *   the text comes from someplace outside the buffer (which is the
     *   case if it's a string, for example) 
     */
    if (len < sizeof(buf))
        buf[len] = '\0';

    /* display a "&" prefix if it's an address of some kind */
    if (val->runstyp == DAT_PROPNUM || val->runstyp == DAT_FNADDR)
        (*dispfn)(dispctx, "&", 1);

    /* display the text */
    if (len != 0)
        (*dispfn)(dispctx, (char *)p, len);

    /* add a closing quote if it's a string and we showed an open quote */
    if (val->runstyp == DAT_SSTRING && !(typ && showtype))
        (*dispfn)(dispctx, "'", 1);
}